

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O3

int WebPWritePGM(FILE *fout,WebPDecBuffer *buffer)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  uint8_t *__ptr;
  uint8_t *__ptr_00;
  uint uVar8;
  uint uVar9;
  size_t __size;
  int iVar10;
  uint8_t *__ptr_01;
  uint8_t *__ptr_02;
  
  uVar9 = 0;
  if (buffer != (WebPDecBuffer *)0x0 && fout != (FILE *)0x0) {
    uVar1 = buffer->height;
    __ptr = (buffer->u).RGBA.rgba;
    __ptr_00 = (buffer->u).YUVA.u;
    __ptr_01 = (buffer->u).YUVA.v;
    __ptr_02 = (buffer->u).YUVA.a;
    uVar8 = uVar1;
    if (__ptr_02 == (uint8_t *)0x0) {
      uVar8 = uVar9;
    }
    if (__ptr_01 != (uint8_t *)0x0 && (__ptr_00 != (uint8_t *)0x0 && __ptr != (uint8_t *)0x0)) {
      iVar7 = buffer->width;
      __size = (size_t)iVar7;
      iVar3 = (int)((uVar1 - ((int)(uVar1 + 1) >> 0x1f)) + 1) >> 1;
      fprintf((FILE *)fout,"P5\n%d %d\n255\n",(ulong)(iVar7 + 1U & 0xfffffffe),
              (ulong)(iVar3 + uVar1 + uVar8));
      if ((int)uVar1 < 1) {
        uVar9 = 1;
      }
      else {
        iVar10 = 1;
        do {
          sVar4 = fwrite(__ptr,__size,1,(FILE *)fout);
          uVar9 = (uint)(sVar4 == 1);
          if ((__size & 1) != 0) {
            fputc(0,(FILE *)fout);
          }
          if (sVar4 != 1) break;
          __ptr = __ptr + (buffer->u).YUVA.y_stride;
          bVar2 = iVar10 < (int)uVar1;
          iVar10 = iVar10 + 1;
        } while (bVar2);
        if (0 < (int)uVar1 && sVar4 == 1) {
          sVar4 = (size_t)((iVar7 - ((int)(iVar7 + 1U) >> 0x1f)) + 1 >> 1);
          iVar7 = 1;
          do {
            sVar5 = fwrite(__ptr_00,sVar4,1,(FILE *)fout);
            sVar6 = fwrite(__ptr_01,sVar4,1,(FILE *)fout);
            uVar9 = (uint)(sVar6 == 1 && sVar5 == 1);
            if (sVar6 != 1 || sVar5 != 1) break;
            __ptr_00 = __ptr_00 + (buffer->u).YUVA.u_stride;
            __ptr_01 = __ptr_01 + (buffer->u).YUVA.v_stride;
            bVar2 = iVar7 < iVar3;
            iVar7 = iVar7 + 1;
          } while (bVar2);
        }
      }
      if ((0 < (int)uVar8 & (byte)uVar9) == 1) {
        iVar7 = 1;
        do {
          sVar4 = fwrite(__ptr_02,__size,1,(FILE *)fout);
          uVar9 = (uint)(sVar4 == 1);
          if ((__size & 1) != 0) {
            fputc(0,(FILE *)fout);
          }
          if (sVar4 != 1) {
            return uVar9;
          }
          __ptr_02 = __ptr_02 + (buffer->u).YUVA.a_stride;
          bVar2 = iVar7 < (int)uVar8;
          iVar7 = iVar7 + 1;
        } while (bVar2);
      }
    }
  }
  return uVar9;
}

Assistant:

int WebPWritePGM(FILE* fout, const WebPDecBuffer* const buffer) {
  if (fout == NULL || buffer == NULL) {
    return 0;
  } else {
    const int width = buffer->width;
    const int height = buffer->height;
    const WebPYUVABuffer* const yuv = &buffer->u.YUVA;
    const uint8_t* src_y = yuv->y;
    const uint8_t* src_u = yuv->u;
    const uint8_t* src_v = yuv->v;
    const uint8_t* src_a = yuv->a;
    const int uv_width = (width + 1) / 2;
    const int uv_height = (height + 1) / 2;
    const int a_height = (src_a != NULL) ? height : 0;
    int ok = 1;
    int y;

    if (src_y == NULL || src_u == NULL || src_v == NULL) return 0;

    fprintf(fout, "P5\n%d %d\n255\n",
            (width + 1) & ~1, height + uv_height + a_height);
    for (y = 0; ok && y < height; ++y) {
      ok &= (fwrite(src_y, width, 1, fout) == 1);
      if (width & 1) fputc(0, fout);    // padding byte
      src_y += yuv->y_stride;
    }
    for (y = 0; ok && y < uv_height; ++y) {
      ok &= (fwrite(src_u, uv_width, 1, fout) == 1);
      ok &= (fwrite(src_v, uv_width, 1, fout) == 1);
      src_u += yuv->u_stride;
      src_v += yuv->v_stride;
    }
    for (y = 0; ok && y < a_height; ++y) {
      ok &= (fwrite(src_a, width, 1, fout) == 1);
      if (width & 1) fputc(0, fout);    // padding byte
      src_a += yuv->a_stride;
    }
    return ok;
  }
}